

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void testing::internal::LogWithLocation(LogSeverity severity,char *file,int line,string *message)

{
  ostream *poVar1;
  int line_00;
  ostringstream s;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  line_00 = (int)message;
  std::__cxx11::ostringstream::ostringstream(local_198);
  FormatFileLocation_abi_cxx11_(&sStack_1b8,(internal *)file,(char *)(ulong)(uint)line,line_00);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&sStack_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::stringbuf::str();
  Log(severity,&sStack_1b8,0);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

GTEST_API_ void LogWithLocation(testing::internal::LogSeverity severity,
                                const char* file, int line,
                                const std::string& message) {
  ::std::ostringstream s;
  s << internal::FormatFileLocation(file, line) << " " << message
    << ::std::endl;
  Log(severity, s.str(), 0);
}